

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::Print(XMLPrinter *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_48;
  char *p;
  undefined1 local_38 [4];
  int len;
  va_list va;
  char *format_local;
  XMLPrinter *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_f8;
  va[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_38 = (undefined1  [4])0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (this->_fp == (FILE *)0x0) {
    p._4_4_ = TIXML_VSCPRINTF(format,(__va_list_tag *)local_38);
    va[0].overflow_arg_area = local_f8;
    va[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_38 = (undefined1  [4])0x10;
    local_48 = DynArray<char,_20>::PushArr(&this->_buffer,p._4_4_);
    local_48 = local_48 + -1;
    vsnprintf(local_48,(long)(p._4_4_ + 1),format,local_38);
  }
  else {
    vfprintf((FILE *)this->_fp,format,local_38);
  }
  return;
}

Assistant:

void XMLPrinter::Print(const char* format, ...)
{
    va_list va;
    va_start(va, format);

    if (_fp) {
        vfprintf(_fp, format, va);
    } else {
        const int len = TIXML_VSCPRINTF(format, va);
        // Close out and re-start the va-args
        va_end(va);
        TIXMLASSERT(len >= 0);
        va_start(va, format);
        TIXMLASSERT(_buffer.Size() > 0 && _buffer[_buffer.Size() - 1] == 0);
        char* p = _buffer.PushArr(len) - 1; // back up over the null terminator.
        TIXML_VSNPRINTF(p, len + 1, format, va);
    }
    va_end(va);
}